

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string___GetSubstitution(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValueUnion p;
  int *piVar3;
  uint32_t uVar4;
  int iVar5;
  uint to;
  int iVar6;
  uint uVar7;
  JSString *pJVar8;
  JSContext *pJVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint32_t to_00;
  JSValueUnion JVar16;
  ulong uVar17;
  uint from;
  JSValue v;
  JSValue this_obj;
  JSValue JVar18;
  JSValue JVar19;
  JSValue obj;
  uint32_t captures_len;
  uint32_t matched_len;
  uint32_t position;
  uint32_t local_9c;
  StringBuffer local_98;
  uint32_t local_78;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t local_6c;
  ulong local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  ulong local_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion local_38;
  int64_t iVar15;
  
  JVar16 = this_val.u;
  if ((*(int *)((long)JVar16.ptr + 0x58) == -7) && (*(int *)((long)JVar16.ptr + 0x18) == -7)) {
    JVar1 = *JVar16.ptr;
    iVar15 = *(int64_t *)((long)JVar16.ptr + 8);
    JVar19 = *JVar16.ptr;
    local_60 = ((JSValue *)((long)JVar16.ptr + 0x10))->u;
    local_58 = (JSValueUnion)((JSValueUnion *)((long)JVar16.ptr + 0x30))->ptr;
    iVar2 = *(int64_t *)((long)JVar16.ptr + 0x38);
    local_38 = *(JSValueUnion *)((long)JVar16.ptr + 0x40);
    local_68 = *(int64_t *)((long)JVar16.ptr + 0x48);
    p = *(JSValueUnion *)&(((JSValue *)((long)JVar16.ptr + 0x50))->u).int32;
    local_98.len = 0;
    local_98.size = 0;
    local_98.is_wide_char = 0;
    local_98.error_status = 0;
    local_98.ctx = ctx;
    pJVar8 = js_alloc_string(ctx,0,0);
    if (pJVar8 == (JSString *)0x0) {
      local_98._16_8_ = local_98._16_8_ & 0xffffffff;
      local_98.error_status = -1;
    }
    local_9c = 0;
    local_98.str = pJVar8;
    pJVar9 = ctx;
    if ((((int)iVar2 == 3) ||
        (obj.tag = iVar2, obj.u.float64 = local_58.float64,
        iVar5 = js_get_length32(ctx,&local_9c,obj), iVar5 == 0)) &&
       (local_40 = iVar2, iVar5 = js_get_length32(ctx,&local_70,JVar19), iVar5 == 0)) {
      piVar3 = (int *)(((JSValue *)((long)JVar16.ptr + 0x20))->u).ptr;
      JVar19 = *(JSValue *)((long)JVar16.ptr + 0x20);
      if (0xfffffff4 < (uint)*(int64_t *)((long)JVar16.ptr + 0x28)) {
        *piVar3 = *piVar3 + 1;
      }
      iVar5 = JS_ToInt32Free(ctx,(int32_t *)&local_6c,JVar19);
      if (-1 < iVar5) {
        to_00 = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
        uVar11 = 0;
        local_48 = JVar1;
        to = string_indexof_char((JSString *)p.ptr,0x24,0);
        uVar4 = local_9c;
        if (-1 < (int)to) {
          local_74 = local_6c;
          local_78 = local_70 + local_6c;
          local_50 = local_68 & 0xffffffff;
          uVar13 = 0;
          do {
            uVar11 = (uint32_t)uVar13;
            uVar17 = (ulong)to;
            if (to_00 <= (uint)(uVar17 + 1)) break;
            string_buffer_concat(&local_98,(JSString *)p.ptr,uVar11,to);
            iVar5 = (int)*(undefined8 *)((long)p.ptr + 4);
            if (iVar5 < 0) {
              uVar10 = (uint)*(ushort *)
                              ((long)&(((JSString *)((long)p.ptr + 0x10))->header).ref_count +
                              uVar17 * 2 + 2);
            }
            else {
              uVar10 = (uint)*(byte *)((long)&(((JSString *)((long)p.ptr + 0x10))->header).ref_count
                                      + uVar17 + 1);
            }
            uVar13 = uVar17 + 2;
            if (uVar10 < 0x27) {
              if (uVar10 == 0x24) {
                string_buffer_putc8(&local_98,0x24);
              }
              else if (uVar10 == 0x26) {
                v.tag = iVar15;
                v.u.float64 = local_48.float64;
                iVar5 = string_buffer_concat_value(&local_98,v);
LAB_00141266:
                pJVar9 = local_98.ctx;
                pJVar8 = local_98.str;
                if (iVar5 != 0) goto LAB_00141149;
              }
              else {
LAB_00141292:
                uVar7 = uVar10 - 0x30;
                from = (uint)uVar13;
                if (uVar7 < 10) {
                  if (from < to_00) {
                    if (iVar5 < 0) {
                      uVar10 = (uint)*(ushort *)
                                      (&((JSString *)((long)p.ptr + 0x10))->field_0x4 + uVar17 * 2);
                    }
                    else {
                      uVar10 = (uint)*(byte *)((long)&(((JSString *)((long)p.ptr + 0x10))->header).
                                                      ref_count + uVar13);
                    }
                    if (uVar10 - 0x30 < 10) {
                      uVar10 = uVar10 + uVar7 * 10;
                      uVar14 = uVar10 - 0x30;
                      if (uVar10 >= 0x31 && uVar4 > uVar14) {
                        uVar7 = uVar14;
                      }
                      uVar12 = to + 3;
                      if (uVar10 < 0x31 || uVar4 <= uVar14) {
                        uVar12 = from;
                      }
                      uVar13 = (ulong)uVar12;
                    }
                  }
                  if (uVar4 <= uVar7 || uVar7 == 0) goto LAB_001413f6;
                  JVar19.tag = local_40;
                  JVar19.u.float64 = local_58.float64;
                  JVar19 = JS_GetPropertyInt64(ctx,JVar19,(ulong)uVar7);
                  if ((int)JVar19.tag != 3) {
                    pJVar9 = local_98.ctx;
                    pJVar8 = local_98.str;
                    if ((int)JVar19.tag != 6) {
                      iVar5 = string_buffer_concat_value_free(&local_98,JVar19);
                      goto LAB_00141266;
                    }
                    goto LAB_00141149;
                  }
                }
                else {
                  if ((uVar10 != 0x3c || local_50 == 3) ||
                     (iVar5 = string_indexof_char((JSString *)p.ptr,0x3e,from), iVar5 < 0)) {
LAB_001413f6:
                    JVar16 = p;
                    uVar11 = (uint32_t)uVar13;
                    goto LAB_00141404;
                  }
                  JVar19 = js_sub_string(ctx,(JSString *)p.ptr,from,iVar5);
                  pJVar9 = local_98.ctx;
                  pJVar8 = local_98.str;
                  if ((int)JVar19.tag == 6) goto LAB_00141149;
                  this_obj.tag = local_68;
                  this_obj.u.float64 = local_38.float64;
                  JVar19 = JS_GetPropertyValue(ctx,this_obj,JVar19);
                  if (((int)JVar19.tag != 3) &&
                     ((pJVar9 = local_98.ctx, pJVar8 = local_98.str, (int)JVar19.tag == 6 ||
                      (iVar6 = string_buffer_concat_value_free(&local_98,JVar19),
                      pJVar9 = local_98.ctx, pJVar8 = local_98.str, iVar6 != 0))))
                  goto LAB_00141149;
                  uVar13 = (ulong)(iVar5 + 1);
                }
              }
            }
            else {
              JVar16 = local_60;
              if (uVar10 == 0x27) {
                uVar11 = *(uint *)((long)local_60.ptr + 4) & 0x7fffffff;
                to = local_78;
              }
              else {
                if (uVar10 != 0x60) goto LAB_00141292;
                to = 0;
                uVar11 = local_74;
              }
LAB_00141404:
              string_buffer_concat(&local_98,(JSString *)JVar16.ptr,to,uVar11);
            }
            uVar11 = (uint32_t)uVar13;
            to = string_indexof_char((JSString *)p.ptr,0x24,uVar11);
          } while (-1 < (int)to);
          to_00 = *(uint *)((long)p.ptr + 4) & 0x7fffffff;
        }
        string_buffer_concat(&local_98,(JSString *)p.ptr,uVar11,to_00);
        JVar19 = string_buffer_end(&local_98);
        iVar15 = JVar19.tag;
        uVar13 = (ulong)JVar19.u.ptr & 0xffffffff00000000;
        uVar17 = (ulong)JVar19.u._0_4_;
        goto LAB_00141179;
      }
    }
LAB_00141149:
    (*(pJVar9->rt->mf).js_free)(&pJVar9->rt->malloc_state,pJVar8);
  }
  else {
    JS_ThrowTypeError(ctx,"not a string");
  }
  uVar17 = 0;
  iVar15 = 6;
  uVar13 = 0;
LAB_00141179:
  JVar18.tag = iVar15;
  JVar18.u.ptr = (void *)(uVar17 | uVar13);
  return JVar18;
}

Assistant:

static JSValue js_string___GetSubstitution(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv)
{
    // GetSubstitution(matched, str, position, captures, namedCaptures, rep)
    JSValueConst matched, str, captures, namedCaptures, rep;
    JSValue capture, name, s;
    uint32_t position, len, matched_len, captures_len;
    int i, j, j0, k, k1;
    int c, c1;
    StringBuffer b_s, *b = &b_s;
    JSString *sp, *rp;

    matched = argv[0];
    str = argv[1];
    captures = argv[3];
    namedCaptures = argv[4];
    rep = argv[5];

    if (!JS_IsString(rep) || !JS_IsString(str))
        return JS_ThrowTypeError(ctx, "not a string");

    sp = JS_VALUE_GET_STRING(str);
    rp = JS_VALUE_GET_STRING(rep);

    string_buffer_init(ctx, b, 0);

    captures_len = 0;
    if (!JS_IsUndefined(captures)) {
        if (js_get_length32(ctx, &captures_len, captures))
            goto exception;
    }
    if (js_get_length32(ctx, &matched_len, matched))
        goto exception;
    if (JS_ToUint32(ctx, &position, argv[2]) < 0)
        goto exception;

    len = rp->len;
    i = 0;
    for(;;) {
        j = string_indexof_char(rp, '$', i);
        if (j < 0 || j + 1 >= len)
            break;
        string_buffer_concat(b, rp, i, j);
        j0 = j++;
        c = string_get(rp, j++);
        if (c == '$') {
            string_buffer_putc8(b, '$');
        } else if (c == '&') {
            if (string_buffer_concat_value(b, matched))
                goto exception;
        } else if (c == '`') {
            string_buffer_concat(b, sp, 0, position);
        } else if (c == '\'') {
            string_buffer_concat(b, sp, position + matched_len, sp->len);
        } else if (c >= '0' && c <= '9') {
            k = c - '0';
            if (j < len) {
                c1 = string_get(rp, j);
                if (c1 >= '0' && c1 <= '9') {
                    /* This behavior is specified in ES6 and refined in ECMA 2019 */
                    /* ECMA 2019 does not have the extra test, but
                       Test262 S15.5.4.11_A3_T1..3 require this behavior */
                    k1 = k * 10 + c1 - '0';
                    if (k1 >= 1 && k1 < captures_len) {
                        k = k1;
                        j++;
                    }
                }
            }
            if (k >= 1 && k < captures_len) {
                s = JS_GetPropertyInt64(ctx, captures, k);
                if (JS_IsException(s))
                    goto exception;
                if (!JS_IsUndefined(s)) {
                    if (string_buffer_concat_value_free(b, s))
                        goto exception;
                }
            } else {
                goto norep;
            }
        } else if (c == '<' && !JS_IsUndefined(namedCaptures)) {
            k = string_indexof_char(rp, '>', j);
            if (k < 0)
                goto norep;
            name = js_sub_string(ctx, rp, j, k);
            if (JS_IsException(name))
                goto exception;
            capture = JS_GetPropertyValue(ctx, namedCaptures, name);
            if (JS_IsException(capture))
                goto exception;
            if (!JS_IsUndefined(capture)) {
                if (string_buffer_concat_value_free(b, capture))
                    goto exception;
            }
            j = k + 1;
        } else {
        norep:
            string_buffer_concat(b, rp, j0, j);
        }
        i = j;
    }
    string_buffer_concat(b, rp, i, rp->len);
    return string_buffer_end(b);
exception:
    string_buffer_free(b);
    return JS_EXCEPTION;
}